

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *rpaths)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  cmRuntimeDependencyArchive *this_00;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  cmUVProcessChainBuilder *this_01;
  istream *piVar9;
  _Alloc_hider _Var10;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  cmUVProcessChain process;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  RegularExpressionMatch pathMatch;
  cmUVProcessChainBuilder builder;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *local_2e8;
  undefined1 local_2e0 [8];
  StdioConfiguration local_2d8;
  StdioConfiguration local_2d0;
  undefined1 local_2c8;
  undefined7 uStack_2c7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  string *local_298;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_290;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_288;
  undefined1 local_280 [88];
  char *local_228;
  cmUVProcessChainBuilder local_1d8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool).Archive;
  pcVar3 = local_1a8 + 0x10;
  local_2e8 = &this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool;
  local_288 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rpaths;
  local_1a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"otool","");
  bVar6 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)local_1a8,&local_2b8);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (!bVar6) {
    local_1a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Could not find otool","");
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar3) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar6 = false;
    goto LAB_004c8c09;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
             (char (*) [3])0x7ba695);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,file);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_1d8);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&local_1d8,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&local_2b8);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_2e0);
  bVar6 = cmUVProcessChain::Valid((cmUVProcessChain *)local_2e0);
  if (bVar6) {
    local_2d8 = (StdioConfiguration)((long)local_2e0 + 0x18);
    local_2d0.Type = None;
    local_2d0.FileDescriptor = 0;
    local_2c8 = 0;
    local_298 = file;
    local_290 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)libs;
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::rpathRegex == '\0') &&
       (iVar8 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::rpathRegex), iVar8 != 0)) {
      GetFileInfo::rpathRegex.regmust = (char *)0x0;
      GetFileInfo::rpathRegex.program = (char *)0x0;
      GetFileInfo::rpathRegex.progsize = 0;
      memset(&GetFileInfo::rpathRegex,0,0xaa);
      cmsys::RegularExpression::compile(&GetFileInfo::rpathRegex,"^ *cmd LC_RPATH$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::rpathRegex);
    }
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::loadDylibRegex == '\0') &&
       (iVar8 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::loadDylibRegex), iVar8 != 0)) {
      GetFileInfo::loadDylibRegex.regmust = (char *)0x0;
      GetFileInfo::loadDylibRegex.program = (char *)0x0;
      GetFileInfo::loadDylibRegex.progsize = 0;
      memset(&GetFileInfo::loadDylibRegex,0,0xaa);
      cmsys::RegularExpression::compile
                (&GetFileInfo::loadDylibRegex,"^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::loadDylibRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::loadDylibRegex);
    }
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::pathRegex == '\0') &&
       (iVar8 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::pathRegex), iVar8 != 0)) {
      GetFileInfo::pathRegex.regmust = (char *)0x0;
      GetFileInfo::pathRegex.program = (char *)0x0;
      GetFileInfo::pathRegex.progsize = 0;
      memset(&GetFileInfo::pathRegex,0,0xaa);
      cmsys::RegularExpression::compile(&GetFileInfo::pathRegex,"^ *path (.*) \\(offset [0-9]+\\)$")
      ;
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::pathRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::pathRegex);
    }
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::nameRegex == '\0') &&
       (iVar8 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::nameRegex), iVar8 != 0)) {
      GetFileInfo::nameRegex.regmust = (char *)0x0;
      GetFileInfo::nameRegex.program = (char *)0x0;
      GetFileInfo::nameRegex.progsize = 0;
      memset(&GetFileInfo::nameRegex,0,0xaa);
      cmsys::RegularExpression::compile(&GetFileInfo::nameRegex,"^ *name (.*) \\(offset [0-9]+\\)$")
      ;
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::nameRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::nameRegex);
    }
    paVar1 = &local_308.field_2;
    psVar2 = (string *)(local_2e0 + 8);
LAB_004c85b1:
    piVar9 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
    cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar9 + -0x18) + (char)piVar9);
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar9,psVar2,cVar7);
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
      memset((RegularExpressionMatch *)local_1a8,0,0xa8);
      bVar6 = cmsys::RegularExpression::find
                        (&GetFileInfo::rpathRegex,(char *)local_2d8,
                         (RegularExpressionMatch *)local_1a8);
      if (!bVar6) goto LAB_004c86f1;
      piVar9 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
      cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar9 + -0x18) + (char)piVar9);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar9,psVar2,cVar7);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
LAB_004c8a3a:
        local_280._0_8_ = local_280 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_280,"Invalid output from otool","");
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_280);
        goto LAB_004c8b59;
      }
      piVar9 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
      cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar9 + -0x18) + (char)piVar9);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar9,psVar2,cVar7);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) goto LAB_004c8a3a;
      memset((RegularExpressionMatch *)local_280,0,0xa8);
      bVar6 = cmsys::RegularExpression::find
                        (&GetFileInfo::pathRegex,(char *)local_2d8,
                         (RegularExpressionMatch *)local_280);
      if (!bVar6) {
        local_308._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Invalid output from otool","");
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,&local_308);
        goto LAB_004c8bbe;
      }
      if ((char *)local_280._8_8_ == (char *)0x0) {
        local_308._M_string_length = 0;
        local_308.field_2._M_local_buf[0] = '\0';
        local_308._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_308._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,local_280._8_8_,local_228);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_288,&local_308);
      goto LAB_004c8825;
    }
    bVar6 = cmUVProcessChain::Wait((cmUVProcessChain *)local_2e0,-1);
    psVar4 = local_298;
    if (bVar6) {
      cmUVProcessChain::GetStatus
                ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *)&local_308,(cmUVProcessChain *)local_2e0);
      if ((*(long **)local_308._M_dataplus._M_p == (long *)0x0) ||
         (**(long **)local_308._M_dataplus._M_p != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to run otool on:\n  ",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
        std::__cxx11::stringbuf::str();
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_280);
        if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
          operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar6 = false;
        bVar5 = false;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_004c8bd6;
      }
      else {
        bVar5 = true;
      }
      bVar6 = bVar5;
      operator_delete(local_308._M_dataplus._M_p,
                      CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                               local_308.field_2._M_local_buf[0]) - (long)local_308._M_dataplus._M_p
                     );
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failed to wait on otool process for:\n  ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
      std::__cxx11::stringbuf::str();
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_280);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
LAB_004c8bd4:
      bVar6 = false;
    }
LAB_004c8bd6:
    if (local_2d8 != (StdioConfiguration)((long)local_2e0 + 0x18)) {
      operator_delete((void *)local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to start otool process for:\n  ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__cxx11::stringbuf::str();
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_280);
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar6 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_2e0);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_1d8.Processes);
LAB_004c8c09:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  return bVar6;
LAB_004c86f1:
  bVar6 = cmsys::RegularExpression::find
                    (&GetFileInfo::loadDylibRegex,(char *)local_2d8,
                     (RegularExpressionMatch *)local_1a8);
  if (!bVar6) goto LAB_004c85b1;
  piVar9 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
  cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar9 + -0x18) + (char)piVar9);
  piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar9,psVar2,cVar7);
  if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
    piVar9 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
    cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar9 + -0x18) + (char)piVar9);
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar9,psVar2,cVar7);
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
      memset((RegularExpressionMatch *)local_280,0,0xa8);
      bVar6 = cmsys::RegularExpression::find
                        (&GetFileInfo::nameRegex,(char *)local_2d8,
                         (RegularExpressionMatch *)local_280);
      if (bVar6) {
        if ((char *)local_280._8_8_ == (char *)0x0) {
          local_308._M_string_length = 0;
          local_308.field_2._M_local_buf[0] = '\0';
          local_308._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_308._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_308,local_280._8_8_,local_228);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_290,&local_308);
LAB_004c8825:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != paVar1) {
          operator_delete(local_308._M_dataplus._M_p,
                          CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                   local_308.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_004c85b1;
      }
      local_308._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Invalid output from otool","");
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,&local_308);
LAB_004c8bbe:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p == paVar1) goto LAB_004c8bd4;
      local_280._16_8_ =
           CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,local_308.field_2._M_local_buf[0])
      ;
      _Var10._M_p = local_308._M_dataplus._M_p;
      goto LAB_004c8bcc;
    }
  }
  local_280._0_8_ = local_280 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,"Invalid output from otool","");
  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_280);
LAB_004c8b59:
  _Var10._M_p = (pointer)local_280._0_8_;
  if ((undefined1 *)local_280._0_8_ == local_280 + 0x10) goto LAB_004c8bd4;
LAB_004c8bcc:
  operator_delete(_Var10._M_p,(ulong)(local_280._16_8_ + 1));
  goto LAB_004c8bd4;
}

Assistant:

bool cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& libs,
  std::vector<std::string>& rpaths)
{
  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("otool", command)) {
    this->SetError("Could not find otool");
    return false;
  }
  command.emplace_back("-l");
  command.emplace_back(file);

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression rpathRegex("^ *cmd LC_RPATH$");
  static const cmsys::RegularExpression loadDylibRegex(
    "^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
  static const cmsys::RegularExpression pathRegex(
    "^ *path (.*) \\(offset [0-9]+\\)$");
  static const cmsys::RegularExpression nameRegex(
    "^ *name (.*) \\(offset [0-9]+\\)$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch cmdMatch;
    if (rpathRegex.find(line.c_str(), cmdMatch)) {
      if (!std::getline(*process.OutputStream(), line) ||
          !std::getline(*process.OutputStream(), line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch pathMatch;
      if (pathRegex.find(line.c_str(), pathMatch)) {
        rpaths.push_back(pathMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    } else if (loadDylibRegex.find(line.c_str(), cmdMatch)) {
      if (!std::getline(*process.OutputStream(), line) ||
          !std::getline(*process.OutputStream(), line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch nameMatch;
      if (nameRegex.find(line.c_str(), nameMatch)) {
        libs.push_back(nameMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run otool on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}